

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdisubwindow.cpp
# Opt level: O2

void __thiscall
QMdiSubWindowPrivate::setWindowFlags(QMdiSubWindowPrivate *this,WindowFlags windowFlags)

{
  uint uVar1;
  uint uVar2;
  QWidget *this_00;
  Data *pDVar3;
  QObject *pQVar4;
  bool bVar5;
  QSize QVar6;
  ulong uVar7;
  ulong uVar8;
  QFlagsStorage<Qt::WindowType> QVar9;
  long in_FS_OFFSET;
  QSize local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(long *)&(this->super_QWidgetPrivate).field_0x10 == 0) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
      QWidgetPrivate::setWindowFlags(&this->super_QWidgetPrivate,windowFlags);
      return;
    }
  }
  else {
    QVar9.i = (uint)windowFlags.super_QFlagsStorageHelper<Qt::WindowType,_4>.
                    super_QFlagsStorage<Qt::WindowType>.i | 0x3000;
    if (((uint)windowFlags.super_QFlagsStorageHelper<Qt::WindowType,_4>.
               super_QFlagsStorage<Qt::WindowType>.i >> 8 & 1) == 0) {
      QVar9.i = (Int)windowFlags.super_QFlagsStorageHelper<Qt::WindowType,_4>.
                     super_QFlagsStorage<Qt::WindowType>.i;
    }
    if ((char)windowFlags.super_QFlagsStorageHelper<Qt::WindowType,_4>.
              super_QFlagsStorage<Qt::WindowType>.i == '\x03') {
      QVar9.i = (uint)windowFlags.super_QFlagsStorageHelper<Qt::WindowType,_4>.
                      super_QFlagsStorage<Qt::WindowType>.i | 0x3000;
    }
    if ((QVar9.i & 0x200f800) == 0) {
      QVar9.i = QVar9.i | 0x800f000;
    }
    else if ((QVar9.i >> 0xb & 1) != 0) {
      QVar9.i = QVar9.i & 0x40800;
    }
    this_00 = *(QWidget **)&(this->super_QWidgetPrivate).field_0x8;
    pDVar3 = this->actions[5].wp.d;
    if (((pDVar3 != (Data *)0x0) && (*(int *)(pDVar3 + 4) != 0)) &&
       (pQVar4 = this->actions[5].wp.value, pQVar4 != (QObject *)0x0)) {
      QAction::setChecked(SUB81(pQVar4,0));
    }
    if ((QVar9.i >> 0xb & 1) != 0) {
      bVar5 = QPointer::operator_cast_to_bool((QPointer *)&this->sizeGrip);
      if (((bVar5) && (pDVar3 = (this->sizeGrip).wp.d, pDVar3 != (Data *)0x0)) &&
         ((*(int *)(pDVar3 + 4) != 0 &&
          (pQVar4 = (this->sizeGrip).wp.value, pQVar4 != (QObject *)0x0)))) {
        (**(code **)(*(long *)pQVar4 + 0x20))();
      }
    }
    QWidgetPrivate::setWindowFlags
              (&this->super_QWidgetPrivate,
               (WindowFlags)
               (((uint)windowFlags.super_QFlagsStorageHelper<Qt::WindowType,_4>.
                       super_QFlagsStorage<Qt::WindowType>.i & 0xff ^ 0x7fffffed) & QVar9.i | 0x12))
    ;
    updateGeometryConstraints(this);
    updateActions(this);
    QVar6 = QWidget::size(this_00);
    if ((this_00->data->widget_attributes & 0x8000) != 0) {
      uVar1 = (this->internalMinimumSize).wd.m_i;
      uVar2 = (this->internalMinimumSize).ht.m_i;
      if (QVar6.ht.m_i.m_i < (int)uVar2 || QVar6.wd.m_i.m_i < (int)uVar1) {
        uVar7 = (ulong)uVar1;
        if ((int)uVar1 < QVar6.wd.m_i.m_i) {
          uVar7 = (ulong)QVar6 & 0xffffffff;
        }
        uVar8 = (ulong)uVar2;
        if ((int)uVar2 < QVar6.ht.m_i.m_i) {
          uVar8 = (ulong)QVar6 >> 0x20;
        }
        local_30 = (QSize)(uVar7 | uVar8 << 0x20);
        QWidget::resize(this_00,&local_30);
      }
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
      return;
    }
  }
  __stack_chk_fail();
}

Assistant:

void QMdiSubWindowPrivate::setWindowFlags(Qt::WindowFlags windowFlags)
{
    Q_Q(QMdiSubWindow);

    if (!parent) {
        QWidgetPrivate::setWindowFlags(windowFlags);
        return;
    }

    Qt::WindowFlags windowType = windowFlags & Qt::WindowType_Mask;
    if (windowType == Qt::Dialog || windowFlags & Qt::MSWindowsFixedSizeDialogHint)
        windowFlags |= Qt::WindowTitleHint | Qt::WindowSystemMenuHint;

    // Set standard flags if none of the customize flags are set
    if (!(windowFlags & CustomizeWindowFlags))
        windowFlags |= Qt::WindowTitleHint | Qt::WindowSystemMenuHint | Qt::WindowMinMaxButtonsHint | Qt::WindowCloseButtonHint;
    else if (windowFlags & Qt::FramelessWindowHint && windowFlags & Qt::WindowStaysOnTopHint)
        windowFlags = Qt::FramelessWindowHint | Qt::WindowStaysOnTopHint;
    else if (windowFlags & Qt::FramelessWindowHint)
        windowFlags = Qt::FramelessWindowHint;

    windowFlags &= ~windowType;
    windowFlags &= ~Qt::WindowFullscreenButtonHint;
    windowFlags |= Qt::SubWindow;

#ifndef QT_NO_ACTION
    if (QAction *stayOnTopAction = actions[QMdiSubWindowPrivate::StayOnTopAction]) {
        if (windowFlags & Qt::WindowStaysOnTopHint)
            stayOnTopAction->setChecked(true);
        else
            stayOnTopAction->setChecked(false);
    }
#endif

#if QT_CONFIG(sizegrip)
    if ((windowFlags & Qt::FramelessWindowHint) && sizeGrip)
        delete sizeGrip;
#endif

    QWidgetPrivate::setWindowFlags(windowFlags);
    updateGeometryConstraints();
    updateActions();
    QSize currentSize = q->size();
    if (q->isVisible() && (currentSize.width() < internalMinimumSize.width()
            || currentSize.height() < internalMinimumSize.height())) {
        q->resize(currentSize.expandedTo(internalMinimumSize));
    }
}